

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterSet.cpp
# Opt level: O2

CharacterSet ZXing::CharacterSetFromString(string_view name)

{
  string_view sv;
  bool bVar1;
  CharacterSet CVar2;
  CharacterSetName *__it;
  CharacterSetName *pCVar3;
  long lVar4;
  size_t in_stack_ffffffffffffff38;
  char *in_stack_ffffffffffffff40;
  long local_b0;
  undefined8 uStack_a8;
  long *local_a0;
  undefined8 local_98;
  undefined1 local_90;
  uint7 uStack_8f;
  undefined8 uStack_88;
  long *local_80;
  undefined8 local_78;
  long local_70;
  undefined8 uStack_68;
  string local_60 [32];
  string local_40 [32];
  
  sv._M_str = in_stack_ffffffffffffff40;
  sv._M_len = in_stack_ffffffffffffff38;
  NormalizeName_abi_cxx11_(sv);
  std::__cxx11::string::string(local_60,local_40);
  std::__cxx11::string::string((string *)&local_a0,local_60);
  local_78 = local_98;
  if (local_a0 == (long *)&local_90) {
    uStack_a8 = uStack_88;
    local_a0 = &local_b0;
  }
  local_98 = 0;
  local_90 = 0;
  local_80 = local_a0;
  if (local_a0 == &local_b0) {
    uStack_68 = uStack_a8;
    local_80 = &local_70;
  }
  local_b0 = (ulong)uStack_8f << 8;
  local_a0 = (long *)&local_90;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff40,(string *)&local_80);
  __it = (CharacterSetName *)&NAME_TO_CHARSET;
  for (lVar4 = 0x3f0; pCVar3 = __it, lVar4 != 0x30; lVar4 = lVar4 + -0x60) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&stack0xffffffffffffff40,__it);
    if (bVar1) goto LAB_0014e5a8;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&stack0xffffffffffffff40,__it + 1);
    pCVar3 = __it + 1;
    if (bVar1) goto LAB_0014e5a8;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&stack0xffffffffffffff40,__it + 2);
    pCVar3 = __it + 2;
    if (bVar1) goto LAB_0014e5a8;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&stack0xffffffffffffff40,__it + 3);
    pCVar3 = __it + 3;
    if (bVar1) goto LAB_0014e5a8;
    __it = __it + 4;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
          ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                        *)&stack0xffffffffffffff40,__it);
  if (!bVar1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0>
            ::operator()((_Iter_pred<ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                          *)&stack0xffffffffffffff40,__it + 1);
    pCVar3 = __it + 1;
    if (!bVar1) {
      pCVar3 = (CharacterSetName *)&PTR_typeinfo_0020ed00;
    }
  }
LAB_0014e5a8:
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  if (pCVar3 == (CharacterSetName *)&PTR_typeinfo_0020ed00) {
    CVar2 = Unknown;
  }
  else {
    CVar2 = pCVar3->cs;
  }
  return CVar2;
}

Assistant:

CharacterSet CharacterSetFromString(std::string_view name)
{
	auto i = FindIf(NAME_TO_CHARSET, [str = NormalizeName(name)](auto& v) { return NormalizeName(v.name) == str; });
	return i == std::end(NAME_TO_CHARSET) ? CharacterSet::Unknown : i->cs;
}